

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.cc
# Opt level: O0

void __thiscall
absl::strings_internal::BigUnsigned<84>::MultiplyStep
          (BigUnsigned<84> *this,int original_size,uint32_t *other_words,int other_size,int step)

{
  int *piVar1;
  ulong uVar2;
  uint64_t product;
  uint64_t carry;
  uint64_t this_word;
  int local_30;
  int other_i;
  int local_28;
  int this_i;
  int step_local;
  int other_size_local;
  uint32_t *other_words_local;
  BigUnsigned<84> *pBStack_10;
  int original_size_local;
  BigUnsigned<84> *this_local;
  
  local_30 = original_size + -1;
  local_28 = step;
  this_i = other_size;
  _step_local = other_words;
  other_words_local._4_4_ = original_size;
  pBStack_10 = this;
  piVar1 = std::min<int>(&local_30,&local_28);
  other_i = *piVar1;
  this_word._4_4_ = local_28 - other_i;
  carry = 0;
  product = 0;
  for (; -1 < other_i && this_word._4_4_ < this_i; other_i = other_i + -1) {
    uVar2 = (ulong)_step_local[this_word._4_4_] * (ulong)this->words_[other_i] + carry;
    product = (uVar2 >> 0x20) + product;
    carry = uVar2 & 0xffffffff;
    this_word._4_4_ = this_word._4_4_ + 1;
  }
  AddWithCarry(this,local_28 + 1,product);
  this->words_[local_28] = (uint32_t)carry;
  if ((carry != 0) && (this->size_ <= local_28)) {
    this->size_ = local_28 + 1;
  }
  return;
}

Assistant:

void BigUnsigned<max_words>::MultiplyStep(int original_size,
                                          const uint32_t* other_words,
                                          int other_size, int step) {
  int this_i = std::min(original_size - 1, step);
  int other_i = step - this_i;

  uint64_t this_word = 0;
  uint64_t carry = 0;
  for (; this_i >= 0 && other_i < other_size; --this_i, ++other_i) {
    uint64_t product = words_[this_i];
    product *= other_words[other_i];
    this_word += product;
    carry += (this_word >> 32);
    this_word &= 0xffffffff;
  }
  AddWithCarry(step + 1, carry);
  words_[step] = this_word & 0xffffffff;
  if (this_word > 0 && size_ <= step) {
    size_ = step + 1;
  }
}